

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_external_replayer_linux.hpp
# Opt level: O2

__pid_t __thiscall Fossilize::ExternalReplayer::Impl::wait(Impl *this,void *__stat_loc)

{
  __pid_t _Var1;
  int iVar2;
  ulong uVar3;
  int *piVar4;
  int *piVar5;
  int i;
  uint uVar6;
  char dummy;
  Progress local_a0;
  
  if (this->pid == -1) goto LAB_001770f2;
  poll_progress(this,&local_a0);
  if (-1 < this->child_fd) {
    uVar3 = read(this->child_fd,&dummy,1);
    if ((int)uVar3 < 0) {
      fwrite("Fossilize ERROR: Failed to wait for child process to end.\n",0x3a,1,_stderr);
    }
    else if ((int)uVar3 != 0) {
      fprintf(_stderr,"Fossilize ERROR: Unexpected return for child process, %d.\n",
              uVar3 & 0xffffffff);
    }
    close(this->child_fd);
    this->child_fd = -1;
  }
  piVar4 = &this->wstatus;
  _Var1 = waitpid(this->pid,piVar4,1);
  if (_Var1 == 0) {
    _Var1 = 0;
    for (uVar6 = 0; (_Var1 == 0 && (uVar6 < 100)); uVar6 = uVar6 + 1) {
      usleep(1000);
      _Var1 = waitpid(this->pid,piVar4,1);
      if (_Var1 < 0) {
        piVar5 = __errno_location();
        *piVar4 = -*piVar5;
        this->synthesized_exit_code = true;
      }
    }
    if (_Var1 == 0) {
      fwrite("Fossilize WARN: waitpid loop timed out.\n",0x28,1,_stderr);
      *piVar4 = 0;
      goto LAB_0017716c;
    }
  }
  else if (_Var1 < 0) {
    fwrite("Fossilize WARN: Child has already been reaped.\n",0x2f,1,_stderr);
    piVar4 = __errno_location();
    this->wstatus = -*piVar4;
LAB_0017716c:
    this->synthesized_exit_code = true;
  }
  poll_progress(this,&local_a0);
  reset_pid(this);
LAB_001770f2:
  iVar2 = wstatus_to_return(this->wstatus,this->synthesized_exit_code);
  return iVar2;
}

Assistant:

int ExternalReplayer::Impl::wait()
{
	if (pid == -1)
		return wstatus_to_return(wstatus, synthesized_exit_code);

	// Pump the fifo through.
	ExternalReplayer::Progress progress = {};
	poll_progress(progress);

#if 0
	// FIXME: This code should be correct. Investigate why it seems to cause stability issues.
	for (;;)
	{
		if (waitpid(pid, &wstatus, 0) < 0)
		{
			LOGE("waitpid failed! errno = %d.\n", errno);
			wstatus = -errno;
			synthesized_exit_code = true;
			break;
		}

		// Child process can receive SIGCONT/SIGSTOP which is benign.
		if (WIFEXITED(wstatus) || WIFSIGNALED(wstatus))
			break;
	}
#else
	// The normal approach here is to use waitpid and block until completion
	// but that approach appears to have some stability issues.
	// The theory is that a parent process might be calling waitpid(-1, NOWAIT) in a thread or signal handler
	// which could confuse things.
	// Instead, use child_fd as a canary for when the child process tree dies.
	if (child_fd >= 0)
	{
		char dummy;
		int r = ::read(child_fd, &dummy, sizeof(dummy));
		if (r < 0)
			LOGE("Failed to wait for child process to end.\n");
		else if (r > 0)
			LOGE("Unexpected return for child process, %d.\n", r);
		close(child_fd);
		child_fd = -1;
	}

	int r = waitpid(pid, &wstatus, WNOHANG);
	if (r == 0)
	{
		// There is a race between the last reference to child_fd being closed
		// and SIGCHLD being delivered.
		// Unfortunately, there is no robust way to poll for waitpid with a timeout
		// (outside of the very recent pidfd in Linux 5.x+),
		// so do it in a dumb way ... We should receive the wstatus shortly.
		for (int i = 0; i < 100 && r == 0; i++)
		{
			usleep(1000);
			r = waitpid(pid, &wstatus, WNOHANG);
			if (r < 0)
			{
				wstatus = -errno;
				synthesized_exit_code = true;
			}
		}

		if (r == 0)
		{
			LOGW("waitpid loop timed out.\n");
			wstatus = 0;
			synthesized_exit_code = true;
		}
	}
	else if (r < 0)
	{
		// Could happen if process has set SIG_IGN or NOCLDWAIT for SIGCHLD.
		LOGW("Child has already been reaped.\n");
		wstatus = -errno;
		synthesized_exit_code = true;
	}
#endif

	// Pump the fifo through.
	poll_progress(progress);
	reset_pid();
	return wstatus_to_return(wstatus, synthesized_exit_code);
}